

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall duckdb::Function::~Function(Function *this)

{
  Function *in_RDI;
  
  ~Function(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Function::~Function() {
}